

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

int __thiscall
ghc::filesystem::path::compare(path *this,basic_string_view<char,_std::char_traits<char>_> s)

{
  int iVar1;
  path local_40;
  path *local_20;
  path *this_local;
  basic_string_view<char,_std::char_traits<char>_> s_local;
  
  s_local._M_len = (size_t)s._M_str;
  this_local = (path *)s._M_len;
  local_20 = this;
  path<std::basic_string_view<char,std::char_traits<char>>,ghc::filesystem::path>
            (&local_40,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,auto_format);
  iVar1 = compare(this,&local_40);
  ~path(&local_40);
  return iVar1;
}

Assistant:

GHC_INLINE int path::compare(basic_string_view<value_type> s) const
{
    return compare(path(s));
}